

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

bech32_error bech32_stripUnknownChars(char *dst,size_t dstlen,char *src,size_t srclen)

{
  long lVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  unsigned_long __n;
  undefined1 local_88 [8];
  string result;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string inputStr;
  size_t srclen_local;
  char *src_local;
  size_t dstlen_local;
  char *dst_local;
  
  if (src == (char *)0x0) {
    dst_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (dst == (char *)0x0) {
    dst_local._4_4_ = E_BECH32_NULL_ARGUMENT;
  }
  else if (srclen < dstlen) {
    dst_local._4_4_ = E_BECH32_LENGTH_TOO_SHORT;
  }
  else {
    inputStr.field_2._8_8_ = srclen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,src,&local_51);
    std::allocator<char>::~allocator(&local_51);
    bech32::stripUnknownChars((string *)local_88,(string *)local_50);
    lVar1 = std::__cxx11::string::size();
    if (dstlen < lVar1 + 1U) {
      dst_local._4_4_ = E_BECH32_LENGTH_TOO_SHORT;
    }
    else {
      __first._M_current = (char *)std::__cxx11::string::begin();
      __n = std::__cxx11::string::size();
      std::copy_n<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long,char*>
                (__first,__n,dst);
      lVar1 = std::__cxx11::string::size();
      dst[lVar1] = '\0';
      dst_local._4_4_ = E_BECH32_SUCCESS;
    }
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_50);
  }
  return dst_local._4_4_;
}

Assistant:

bech32_error bech32_stripUnknownChars(
        char *dst, size_t dstlen,
        const char *src, size_t srclen) {

    if(src == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dst == nullptr)
        return E_BECH32_NULL_ARGUMENT;
    if(dstlen > srclen)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::string inputStr(src);
    std::string result = bech32::stripUnknownChars(inputStr);
    if(dstlen < result.size()+1)
        return E_BECH32_LENGTH_TOO_SHORT;

    std::copy_n(result.begin(), result.size(), dst);
    dst[result.size()] = '\0';

    return E_BECH32_SUCCESS;
}